

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

bool crnd::crnd_get_level_info
               (void *pData,uint32 data_size,uint32 level_index,crn_level_info *pLevel_info)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  crn_header *pcVar4;
  int iVar5;
  int *in_RCX;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  bool bVar6;
  uint32 height;
  uint32 width;
  crn_header *pHeader;
  uint32 in_stack_ffffffffffffffd4;
  void *in_stack_ffffffffffffffd8;
  bool local_1;
  
  if (((in_RDI == 0) || (in_ESI < 0x3e)) || (in_RCX == (int *)0x0)) {
    local_1 = false;
  }
  else if (*in_RCX == 0x28) {
    pcVar4 = crnd_get_header(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
    if (pcVar4 == (crn_header *)0x0) {
      local_1 = false;
    }
    else {
      uVar1 = crn_packed_uint::operator_cast_to_unsigned_int((crn_packed_uint *)&pcVar4->m_levels);
      if (in_EDX < uVar1) {
        uVar1 = crn_packed_uint::operator_cast_to_unsigned_int((crn_packed_uint *)&pcVar4->m_width);
        uVar1 = math::maximum<unsigned_int>(1,uVar1 >> ((byte)in_EDX & 0x1f));
        uVar2 = crn_packed_uint::operator_cast_to_unsigned_int((crn_packed_uint *)&pcVar4->m_height)
        ;
        uVar2 = math::maximum<unsigned_int>(1,uVar2 >> ((byte)in_EDX & 0x1f));
        in_RCX[1] = uVar1;
        in_RCX[2] = uVar2;
        uVar3 = crn_packed_uint::operator_cast_to_unsigned_int((crn_packed_uint *)&pcVar4->m_faces);
        in_RCX[3] = uVar3;
        in_RCX[4] = uVar1 + 3 >> 2;
        in_RCX[5] = uVar2 + 3 >> 2;
        uVar1 = crn_packed_uint::operator_cast_to_unsigned_int((crn_packed_uint *)&pcVar4->m_format)
        ;
        bVar6 = true;
        if (uVar1 != 0) {
          uVar1 = crn_packed_uint::operator_cast_to_unsigned_int
                            ((crn_packed_uint *)&pcVar4->m_format);
          bVar6 = uVar1 == 9;
        }
        iVar5 = 0x10;
        if (bVar6) {
          iVar5 = 8;
        }
        in_RCX[6] = iVar5;
        uVar1 = crn_packed_uint::operator_cast_to_unsigned_int((crn_packed_uint *)&pcVar4->m_format)
        ;
        *(ulong *)(in_RCX + 8) = (ulong)uVar1;
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool crnd_get_level_info(const void* pData, uint32 data_size, uint32 level_index, crn_level_info* pLevel_info) {
  if ((!pData) || (data_size < cCRNHeaderMinSize) || (!pLevel_info))
    return false;

  if (pLevel_info->m_struct_size != sizeof(crn_level_info))
    return false;

  const crn_header* pHeader = crnd_get_header(pData, data_size);
  if (!pHeader)
    return false;

  if (level_index >= pHeader->m_levels)
    return false;

  uint32 width = math::maximum<uint32>(1U, pHeader->m_width >> level_index);
  uint32 height = math::maximum<uint32>(1U, pHeader->m_height >> level_index);

  pLevel_info->m_width = width;
  pLevel_info->m_height = height;
  pLevel_info->m_faces = pHeader->m_faces;
  pLevel_info->m_blocks_x = (width + 3) >> 2;
  pLevel_info->m_blocks_y = (height + 3) >> 2;
  pLevel_info->m_bytes_per_block = ((pHeader->m_format == cCRNFmtDXT1) || (pHeader->m_format == cCRNFmtDXT5A)) ? 8 : 16;
  pLevel_info->m_format = static_cast<crn_format>((uint32)pHeader->m_format);

  return true;
}